

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O1

void tcase_add_fixture(TCase *tc,SFun setup,SFun teardown,int ischecked)

{
  List *pLVar1;
  uint *puVar2;
  
  if (setup != (SFun)0x0) {
    pLVar1 = (&tc->unch_sflst)[(ulong)(ischecked != 0) * 2];
    puVar2 = (uint *)emalloc(0x10);
    *(SFun *)(puVar2 + 2) = setup;
    *puVar2 = (uint)(ischecked != 0);
    check_list_add_end(pLVar1,puVar2);
  }
  if (teardown != (SFun)0x0) {
    pLVar1 = (&tc->unch_tflst)[(ulong)(ischecked != 0) * 2];
    puVar2 = (uint *)emalloc(0x10);
    *(SFun *)(puVar2 + 2) = teardown;
    *puVar2 = (uint)(ischecked != 0);
    check_list_add_front(pLVar1,puVar2);
    return;
  }
  return;
}

Assistant:

static void tcase_add_fixture(TCase * tc, SFun setup, SFun teardown,
                              int ischecked)
{
    if(setup)
    {
        if(ischecked)
            check_list_add_end(tc->ch_sflst,
                               fixture_create(setup, ischecked));
        else
            check_list_add_end(tc->unch_sflst,
                               fixture_create(setup, ischecked));
    }

    /* Add teardowns at front so they are run in reverse order. */
    if(teardown)
    {
        if(ischecked)
            check_list_add_front(tc->ch_tflst,
                                 fixture_create(teardown, ischecked));
        else
            check_list_add_front(tc->unch_tflst,
                                 fixture_create(teardown, ischecked));
    }
}